

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  int iVar5;
  int iVar6;
  int *natural_order;
  uint local_48;
  int m;
  int v;
  int k;
  int sign;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + -1;
  }
  if (*(int *)&pjVar2[2].start_pass != -1) {
    piVar3 = cinfo->natural_order;
    paJVar4 = *MCU_data;
    iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
    for (m = cinfo->Ss; m <= cinfo->Se; m = m + 1) {
      _sign = (&pjVar2[0xc].decode_mcu)[iVar1] + (m + -1) * 3;
      iVar5 = arith_decode(cinfo,(uchar *)_sign);
      if (iVar5 != 0) {
        return 1;
      }
      while (iVar5 = arith_decode(cinfo,(uchar *)(_sign + 1)), iVar5 == 0) {
        _sign = _sign + 3;
        m = m + 1;
        if (cinfo->Se < m) {
          cinfo->err->msg_code = 0x75;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
          return 1;
        }
      }
      iVar5 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
      _sign = _sign + 2;
      natural_order._4_4_ = arith_decode(cinfo,(uchar *)_sign);
      if ((natural_order._4_4_ != 0) && (iVar6 = arith_decode(cinfo,(uchar *)_sign), iVar6 != 0)) {
        natural_order._4_4_ = natural_order._4_4_ << 1;
        iVar6 = 0xd9;
        if (m <= (int)(uint)cinfo->arith_ac_K[iVar1]) {
          iVar6 = 0xbd;
        }
        _sign = (&pjVar2[0xc].decode_mcu)[iVar1] + iVar6;
        while (iVar6 = arith_decode(cinfo,(uchar *)_sign), iVar6 != 0) {
          natural_order._4_4_ = natural_order._4_4_ << 1;
          if (natural_order._4_4_ == 0x8000) {
            cinfo->err->msg_code = 0x75;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
            *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
            return 1;
          }
          _sign = _sign + 1;
        }
      }
      local_48 = natural_order._4_4_;
      while (natural_order._4_4_ = (int)natural_order._4_4_ >> 1, natural_order._4_4_ != 0) {
        iVar6 = arith_decode(cinfo,(uchar *)(_sign + 0xe));
        if (iVar6 != 0) {
          local_48 = natural_order._4_4_ | local_48;
        }
      }
      local_48 = local_48 + 1;
      if (iVar5 != 0) {
        local_48 = -local_48;
      }
      (*paJVar4)[piVar3[m]] = (JCOEF)(local_48 << ((byte)cinfo->Al & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

  /* Figure F.20: Decode_AC_coefficients */
  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (arith_decode(cinfo, st)) break;		/* EOB flag */
    while (arith_decode(cinfo, st + 1) == 0) {
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
    /* Figure F.21: Decoding nonzero value v */
    /* Figure F.22: Decoding the sign of v */
    sign = arith_decode(cinfo, entropy->fixed_bin);
    st += 2;
    /* Figure F.23: Decoding the magnitude category of v */
    if ((m = arith_decode(cinfo, st)) != 0) {
      if (arith_decode(cinfo, st)) {
	m <<= 1;
	st = entropy->ac_stats[tbl] +
	     (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
    }
    v = m;
    /* Figure F.24: Decoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      if (arith_decode(cinfo, st)) v |= m;
    v += 1; if (sign) v = -v;
    /* Scale and output coefficient in natural (dezigzagged) order */
    (*block)[natural_order[k]] = (JCOEF) (v << cinfo->Al);
  }

  return TRUE;
}